

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc_analyzer.cc
# Opt level: O0

void __thiscall
sptk::reaper::LpcAnalyzer::HannWindow(LpcAnalyzer *this,float *din,float *dout,int n,float preemp)

{
  size_type sVar1;
  reference pvVar2;
  int in_ECX;
  float *in_RDX;
  float *in_RSI;
  size_type in_RDI;
  float in_XMM0_Da;
  double dVar3;
  double half;
  double arg;
  float *p;
  int i;
  double dVar4;
  double dVar5;
  float *local_30;
  int local_24;
  float *local_18;
  float *local_10;
  
  sVar1 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x18));
  if (sVar1 != (long)in_ECX) {
    dVar4 = 0.5;
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)0x3fe0000000000000,in_RDI);
    for (local_24 = 0; local_24 < in_ECX; local_24 = local_24 + 1) {
      dVar5 = dVar4;
      dVar3 = cos((dVar4 + (double)local_24) * (6.283185307179586 / (double)in_ECX));
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x18),(long)local_24);
      *pvVar2 = (float)(-dVar4 * dVar3 + dVar4);
      dVar4 = dVar5;
    }
  }
  if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
    local_30 = in_RSI + 1;
    local_18 = in_RDX;
    local_10 = in_RSI;
    for (local_24 = 0; local_24 < in_ECX; local_24 = local_24 + 1) {
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x18),(long)local_24);
      *local_18 = *pvVar2 * (-in_XMM0_Da * *local_10 + *local_30);
      local_30 = local_30 + 1;
      local_18 = local_18 + 1;
      local_10 = local_10 + 1;
    }
  }
  else {
    local_18 = in_RDX;
    local_10 = in_RSI;
    for (local_24 = 0; local_24 < in_ECX; local_24 = local_24 + 1) {
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x18),(long)local_24);
      *local_18 = *pvVar2 * *local_10;
      local_18 = local_18 + 1;
      local_10 = local_10 + 1;
    }
  }
  return;
}

Assistant:

void LpcAnalyzer::HannWindow(const float* din, float* dout, int n,
                             float preemp) {
  int i;
  const float *p;

  // Need to create a new Hanning window? */
  if (window_.size() != static_cast<size_t>(n)) {
    double arg, half = 0.5;
    window_.resize(n);
    for (i = 0, arg = M_PI * 2.0 / n; i < n; ++i)
      window_[i] = (half - half * cos((half + i) * arg));
  }
  /* If preemphasis is to be performed,  this assumes that there are n+1 valid
     samples in the input buffer (din). */
  if (preemp != 0.0) {
    for (i = 0, p = din + 1; i < n; ++i)
      *dout++ = window_[i] * (*p++ - (preemp * *din++));
  } else {
    for (i = 0; i < n; ++i)
      *dout++ = window_[i] * *din++;
  }
}